

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O3

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,DotExpression *expression)

{
  iterator *piVar1;
  _Elt_pointer ppSVar2;
  Expression *pEVar3;
  SymbolTable *pSVar4;
  Type *pTVar5;
  
  pEVar3 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  pSVar4 = NamedType::getSymbolTable((NamedType *)this->lastType);
  ppSVar2 = (this->symbolTableStack).c.
            super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar2 ==
      (this->symbolTableStack).c.
      super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<hdc::SymbolTable*,std::allocator<hdc::SymbolTable*>>::
    _M_push_back_aux<hdc::SymbolTable*const&>
              ((deque<hdc::SymbolTable*,std::allocator<hdc::SymbolTable*>> *)&this->symbolTableStack
               ,&this->symbolTable);
  }
  else {
    *ppSVar2 = this->symbolTable;
    piVar1 = &(this->symbolTableStack).c.
              super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  this->symbolTable = pSVar4;
  pEVar3 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  pEVar3 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  pTVar5 = Expression::getType(pEVar3);
  this->lastType = pTVar5;
  if (pTVar5 != (Type *)0x0) {
    (**(pTVar5->super_ASTNode)._vptr_ASTNode)(pTVar5,this);
  }
  popSymbolTable(this);
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(DotExpression* expression) {
    NamedType* t = nullptr;
    SymbolTable* s = nullptr;

    expression->getLeft()->accept(this);
    t = (NamedType*) lastType;
    s = t->getSymbolTable();

    pushSymbolTable(s);
    expression->getRight()->accept(this);
    setLastType(expression->getRight()->getType());
    popSymbolTable();
}